

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.h
# Opt level: O0

BigInt * __thiscall BigInt::operator-(BigInt *__return_storage_ptr__,BigInt *this,BigInt *that)

{
  longlong lVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  size_type sVar5;
  long lVar6;
  const_reference pvVar7;
  reference pvVar8;
  long local_110;
  BigInt local_d8;
  BigInt local_b8;
  uint local_98;
  int local_94;
  int borrow;
  int i;
  BigInt res;
  BigInt local_60;
  BigInt local_40;
  BigInt *local_20;
  BigInt *that_local;
  BigInt *this_local;
  
  local_20 = that;
  that_local = this;
  this_local = __return_storage_ptr__;
  if (this->sign == that->sign) {
    abs(&local_40,(int)this);
    abs(&local_60,(int)local_20);
    bVar4 = operator>=(&local_40,&local_60);
    ~BigInt(&local_60);
    ~BigInt(&local_40);
    if (bVar4) {
      BigInt((BigInt *)&borrow,this);
      local_98 = 0;
      for (local_94 = 0; iVar2 = local_94,
          sVar5 = std::vector<long_long,_std::allocator<long_long>_>::size(&local_20->vector_value),
          iVar3 = local_94, iVar2 < (int)sVar5 || local_98 != 0; local_94 = local_94 + 1) {
        lVar6 = (long)(int)local_98;
        sVar5 = std::vector<long_long,_std::allocator<long_long>_>::size(&local_20->vector_value);
        if (iVar3 < (int)sVar5) {
          pvVar7 = std::vector<long_long,_std::allocator<long_long>_>::operator[]
                             (&local_20->vector_value,(long)local_94);
          local_110 = *pvVar7;
        }
        else {
          local_110 = 0;
        }
        pvVar8 = std::vector<long_long,_std::allocator<long_long>_>::operator[]
                           ((vector<long_long,_std::allocator<long_long>_> *)&borrow,(long)local_94)
        ;
        *pvVar8 = *pvVar8 - (lVar6 + local_110);
        pvVar8 = std::vector<long_long,_std::allocator<long_long>_>::operator[]
                           ((vector<long_long,_std::allocator<long_long>_> *)&borrow,(long)local_94)
        ;
        lVar1 = base;
        local_98 = (uint)(*pvVar8 < 0);
        if (local_98 != 0) {
          pvVar8 = std::vector<long_long,_std::allocator<long_long>_>::operator[]
                             ((vector<long_long,_std::allocator<long_long>_> *)&borrow,
                              (long)local_94);
          *pvVar8 = lVar1 + *pvVar8;
        }
      }
      trim(__return_storage_ptr__,(BigInt *)&borrow);
      ~BigInt((BigInt *)&borrow);
    }
    else {
      operator-(&local_b8,local_20,this);
      operator-(__return_storage_ptr__,&local_b8);
      ~BigInt(&local_b8);
    }
  }
  else {
    operator-(&local_d8,that);
    operator+(__return_storage_ptr__,this,&local_d8);
    ~BigInt(&local_d8);
  }
  return __return_storage_ptr__;
}

Assistant:

BigInt operator-(const BigInt &that) const { //! subtraction operator overloading
        if (sign == that.sign) {
            //! assuming this >= that to implement borrow
            if (abs() >= that.abs()) {
                BigInt res = *this;

                //! keep looping for all digits until exhausted considering the carry
                for (int i = 0, borrow = 0; i < (int) that.vector_value.size() || borrow; ++i) {
                    res.vector_value[i] -= borrow + (i < (int) that.vector_value.size() ? that.vector_value[i] : 0);

                    borrow = res.vector_value[i] < 0; //! if we have borrow this will be negative, borrow it from the next digit

                    if (borrow)
                        res.vector_value[i] += base; //! take the borrow we are guaranteed to find borrow  since a>=b
                }

                return res.trim();
            }
            //!-ve as common factor
            return -(that - *this); //! reorder
        }

        //! A-B have different signs represent them as addition
        return *this + (-that);
    }